

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O3

void fight_prog_skean(OBJ_DATA *obj,CHAR_DATA *ch)

{
  MOB_INDEX_DATA *pMVar1;
  bool bVar2;
  int iVar3;
  CClass *pCVar4;
  AFFECT_DATA af;
  AFFECT_DATA local_80;
  
  bVar2 = is_worn(obj);
  if (!bVar2) {
    return;
  }
  iVar3 = number_percent();
  if (iVar3 < 6) {
    number_percent();
    pCVar4 = ch->fighting->my_class;
    if ((pCVar4 == (CClass *)0x0) &&
       ((pMVar1 = ch->fighting->pIndexData, pMVar1 == (MOB_INDEX_DATA *)0x0 ||
        (pCVar4 = pMVar1->my_class, pCVar4 == (CClass *)0x0)))) {
      pCVar4 = CClass::GetClass(0);
    }
    if ((pCVar4->ctype != 2) || (bVar2 = is_affected(ch->fighting,(int)gsn_severed), bVar2)) {
      if ((ch->affected_by[0] & 1) != 0) {
        bVar2 = is_good(ch->fighting);
        if (!bVar2) {
          return;
        }
        act("You swoon for a moment, and the world goes slightly hazy...",ch->fighting,(void *)0x0,
            (void *)0x0,3);
        WAIT_STATE(ch->fighting,0x18);
        return;
      }
      act("An enchanted obsidian skean darts toward your eyes, gouging you painfully!",ch,
          (void *)0x0,ch->fighting,2);
      act("An enchanted obsidian skean darts toward $N\'s eyes, gouging $M painfully!",ch,
          (void *)0x0,ch->fighting,1);
      init_affect(&local_80);
      local_80.where = 0;
      local_80.aftype = 1;
      local_80.level = ch->level;
      local_80.type = gsn_bleeding;
      local_80.bitvector[0]._0_1_ = (byte)local_80.bitvector[0] | 1;
      iVar3 = 4;
    }
    else {
      act("An enchanted obsidian skean blazes through the air, leaving a trail of fire!",ch,
          (void *)0x0,ch->fighting,0);
      act("Your vital ties to the gods\' empowerment have been severed!",ch,(void *)0x0,ch->fighting
          ,2);
      init_affect(&local_80);
      local_80.where = 0;
      local_80.aftype = 1;
      local_80.type = gsn_severed;
      local_80.level = ch->level;
      iVar3 = dice(1,8);
      local_80.modifier = (short)iVar3 + 10;
      iVar3 = 2;
    }
    iVar3 = dice(1,iVar3);
    local_80.duration = (short)iVar3;
    new_affect_to_char(ch->fighting,&local_80);
    return;
  }
  return;
}

Assistant:

void fight_prog_skean(OBJ_DATA *obj, CHAR_DATA *ch)
{
	int percent;
	AFFECT_DATA af;

	if (!is_worn(obj))
		return;

	if (number_percent() < 6)
	{
		percent = number_percent();
		if (ch->fighting->Class()->ctype == CLASS_COMMUNER && !is_affected(ch->fighting, gsn_severed))
		{
			act("An enchanted obsidian skean blazes through the air, leaving a trail of fire!", ch, 0, ch->fighting, TO_ROOM);
			act("Your vital ties to the gods' empowerment have been severed!", ch, 0, ch->fighting, TO_VICT);

			init_affect(&af);
			af.where = TO_AFFECTS;
			af.aftype = AFT_SKILL;
			af.type = gsn_severed;
			af.level = ch->level;
			af.modifier = 10 + dice(1, 8);
			af.duration = dice(1, 2);
			new_affect_to_char(ch->fighting, &af);

			return;
		}

		if (!IS_SET(ch->affected_by, AFF_BLIND))
		{
			act("An enchanted obsidian skean darts toward your eyes, gouging you painfully!", ch, 0, ch->fighting, TO_VICT);
			act("An enchanted obsidian skean darts toward $N's eyes, gouging $M painfully!", ch, 0, ch->fighting, TO_NOTVICT);

			init_affect(&af);
			af.where = TO_AFFECTS;
			af.aftype = AFT_SKILL;
			af.level = ch->level;
			af.type = gsn_bleeding;

			SET_BIT(af.bitvector, AFF_BLIND);
			af.duration = dice(1, 4);
			new_affect_to_char(ch->fighting, &af);

			return;
		}

		if (is_good(ch->fighting))
		{
			act("You swoon for a moment, and the world goes slightly hazy...", ch->fighting, 0, 0, TO_CHAR);
			WAIT_STATE(ch->fighting, PULSE_VIOLENCE * 2);
			return;
		}
	}
}